

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O1

void __thiscall
cmParseCoberturaCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  char *pcVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  iterator __position;
  XMLParser *pXVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  string *filePath;
  pointer pbVar12;
  char **ppcVar13;
  basic_string_view<char,_std::char_traits<char>_> __str;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string filename;
  string FoundSource;
  string finalpath;
  string line;
  ifstream fin;
  undefined1 auStack_448 [8];
  key_type *local_440;
  XMLParser *local_438;
  string local_430;
  long *local_410;
  _func_int **local_408;
  long local_400 [2];
  undefined1 *local_3f0;
  undefined8 local_3e8;
  undefined1 local_3e0;
  undefined7 uStack_3df;
  string local_3d0;
  undefined1 local_3b0 [8];
  pointer local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  char *local_390;
  undefined8 local_388;
  size_t local_380;
  char *local_378;
  undefined8 local_370;
  ios_base local_340 [264];
  undefined1 local_238 [24];
  undefined8 local_220;
  char *local_218;
  undefined8 local_210;
  _func_int **local_208;
  long *local_200;
  undefined8 local_1f8;
  ios_base local_1c8 [408];
  
  local_3f0 = &local_3e0;
  local_3e8 = 0;
  local_3e0 = 0;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  iVar6 = std::__cxx11::string::compare((char *)name);
  if (iVar6 == 0) {
    this->InSource = true;
    goto LAB_001fe718;
  }
  iVar6 = std::__cxx11::string::compare((char *)name);
  if (iVar6 == 0) {
    this->InSources = true;
    goto LAB_001fe718;
  }
  iVar6 = std::__cxx11::string::compare((char *)name);
  local_438 = this;
  if (iVar6 != 0) {
    iVar6 = std::__cxx11::string::compare((char *)name);
    if ((iVar6 == 0) && (local_438->SkipThisClass == false)) {
      ppcVar13 = atts + 1;
      iVar6 = -1;
      uVar8 = 0xffffffff;
      while( true ) {
        pcVar1 = ppcVar13[-1];
        iVar7 = strcmp(pcVar1,"hits");
        if (iVar7 == 0) {
          iVar6 = atoi(*ppcVar13);
        }
        else {
          iVar7 = strcmp(pcVar1,"number");
          if (iVar7 == 0) {
            uVar8 = atoi(*ppcVar13);
          }
        }
        if (0 < (int)uVar8 && -1 < iVar6) break;
        ppcVar13 = ppcVar13 + 1;
      }
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_438->Coverage->TotalCoverage,&local_438->CurFileName);
      (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(ulong)uVar8 - 1] = iVar6;
    }
    goto LAB_001fe718;
  }
  do {
    iVar6 = strcmp(*atts,"filename");
    atts = atts + 1;
  } while (iVar6 != 0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Reading file: ",0xe);
  pcVar1 = *atts;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)(auStack_448 + (long)*(_func_int **)(local_238._0_8_ + -0x18)) + 0x210);
  }
  else {
    sVar9 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar1,sVar9);
  }
  std::ios::widen((char)(ostream *)local_238 + (char)*(_func_int **)(local_238._0_8_ + -0x18));
  std::ostream::put((char)local_238);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
               ,0x3f,(char *)local_3b0,this->Coverage->Quiet);
  if (local_3b0 != (undefined1  [8])&local_3a0) {
    operator_delete((void *)local_3b0,local_3a0._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base(local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,*atts,(allocator<char> *)local_238);
  local_440 = &this->CurFileName;
  (this->CurFileName)._M_string_length = 0;
  *(this->CurFileName)._M_dataplus._M_p = '\0';
  pbVar12 = (this->FilePaths).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->FilePaths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 != pbVar3) {
    do {
      local_238._0_8_ = local_408;
      local_238._8_8_ = local_410;
      __str._M_str = (pbVar12->_M_dataplus)._M_p;
      __str._M_len = pbVar12->_M_string_length;
      iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_238,0,
                         pbVar12->_M_string_length,__str);
      if (iVar6 == 0) {
        std::__cxx11::string::_M_assign((string *)local_440);
        break;
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar3);
  }
  if ((this->CurFileName)._M_string_length == 0) {
    pbVar12 = (local_438->FilePaths).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (local_438->FilePaths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar12 != pbVar3) {
      do {
        while( true ) {
          local_238._8_8_ = (pbVar12->_M_dataplus)._M_p;
          local_238._0_8_ = pbVar12->_M_string_length;
          local_238._16_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_220 = 1;
          local_218 = "/";
          local_210 = 0;
          local_208 = local_408;
          local_200 = local_410;
          local_1f8 = 0;
          views_00._M_len = 3;
          views_00._M_array = (iterator)local_238;
          cmCatViews((string *)local_3b0,views_00);
          std::__cxx11::string::operator=((string *)&local_3d0,(string *)local_3b0);
          if (local_3b0 != (undefined1  [8])&local_3a0) {
            operator_delete((void *)local_3b0,local_3a0._M_allocated_capacity + 1);
          }
          bVar5 = cmsys::SystemTools::FileExists(&local_3d0);
          if (!bVar5) break;
          std::__cxx11::string::_M_assign((string *)local_440);
          pbVar12 = pbVar12 + 1;
          if (bVar5 || pbVar12 == pbVar3) goto LAB_001fe303;
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != pbVar3);
    }
  }
LAB_001fe303:
  std::ifstream::ifstream(local_238,(local_440->_M_dataplus)._M_p,_S_in);
  pXVar4 = local_438;
  if (((local_438->CurFileName)._M_string_length == 0) ||
     ((*(byte *)((long)&local_218 + (long)*(_func_int **)(local_238._0_8_ + -0x18)) & 5) != 0)) {
    local_3a8 = (local_438->Coverage->BinaryDir)._M_dataplus._M_p;
    local_3b0 = (undefined1  [8])(local_438->Coverage->BinaryDir)._M_string_length;
    local_3a0._M_allocated_capacity = 0;
    local_3a0._8_8_ = 1;
    local_390 = "/";
    local_388 = 0;
    pcVar1 = *atts;
    local_380 = strlen(pcVar1);
    local_370 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_3b0;
    local_378 = pcVar1;
    cmCatViews(&local_430,views);
    std::__cxx11::string::operator=((string *)local_440,(string *)&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_430._M_dataplus._M_p._4_4_,local_430._M_dataplus._M_p._0_4_) !=
        &local_430.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_430._M_dataplus._M_p._4_4_,local_430._M_dataplus._M_p._0_4_),
                      local_430.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::open(local_238,(_Ios_Openmode)(local_440->_M_dataplus)._M_p);
    if ((*(byte *)((long)&local_218 + (long)*(_func_int **)(local_238._0_8_ + -0x18)) & 5) == 0)
    goto LAB_001fe4f7;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Skipping system file ",0x15);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,(char *)local_410,(long)local_408);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    pcVar2 = pXVar4->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
                 ,0x61,(char *)CONCAT44(local_430._M_dataplus._M_p._4_4_,
                                        local_430._M_dataplus._M_p._0_4_),pXVar4->Coverage->Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_430._M_dataplus._M_p._4_4_,local_430._M_dataplus._M_p._0_4_) !=
        &local_430.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_430._M_dataplus._M_p._4_4_,local_430._M_dataplus._M_p._0_4_),
                      local_430.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    pXVar4->SkipThisClass = true;
  }
  else {
LAB_001fe4f7:
    local_3b0 = (undefined1  [8])&local_3a0;
    local_3a8 = (pointer)0x0;
    local_3a0._M_allocated_capacity = local_3a0._M_allocated_capacity & 0xffffffffffffff00;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&pXVar4->Coverage->TotalCoverage,local_440);
    while (bVar5 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_238,(string *)local_3b0,(bool *)0x0,
                              0xffffffffffffffff), bVar5) {
      local_430._M_dataplus._M_p._0_4_ = 0xffffffff;
      __position._M_current =
           (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pmVar11,__position,(int *)&local_430);
      }
      else {
        *__position._M_current = -1;
        (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    if (local_3b0 != (undefined1  [8])&local_3a0) {
      operator_delete((void *)local_3b0,local_3a0._M_allocated_capacity + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  if (local_410 != local_400) {
    operator_delete(local_410,local_400[0] + 1);
  }
LAB_001fe718:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT71(local_3d0.field_2._M_allocated_capacity._1_7_,
                             local_3d0.field_2._M_local_buf[0]) + 1);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
  }
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    std::string FoundSource;
    std::string finalpath;
    if (name == "source") {
      this->InSource = true;
    } else if (name == "sources") {
      this->InSources = true;
    } else if (name == "class") {
      int tagCount = 0;
      while (true) {
        if (strcmp(atts[tagCount], "filename") == 0) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Reading file: " << atts[tagCount + 1]
                                              << std::endl,
                             this->Coverage.Quiet);
          std::string filename = atts[tagCount + 1];
          this->CurFileName.clear();

          // Check if this is an absolute path that falls within our
          // source or binary directories.
          for (std::string const& filePath : this->FilePaths) {
            if (cmHasPrefix(filename, filePath)) {
              this->CurFileName = filename;
              break;
            }
          }

          if (this->CurFileName.empty()) {
            // Check if this is a path that is relative to our source or
            // binary directories.
            for (std::string const& filePath : this->FilePaths) {
              finalpath = cmStrCat(filePath, "/", filename);
              if (cmSystemTools::FileExists(finalpath)) {
                this->CurFileName = finalpath;
                break;
              }
            }
          }

          cmsys::ifstream fin(this->CurFileName.c_str());
          if (this->CurFileName.empty() || !fin) {
            this->CurFileName =
              cmStrCat(this->Coverage.BinaryDir, "/", atts[tagCount + 1]);
            fin.open(this->CurFileName.c_str());
            if (!fin) {
              cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                                 "Skipping system file " << filename
                                                         << std::endl,
                                 this->Coverage.Quiet);

              this->SkipThisClass = true;
              break;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            curFileLines.push_back(-1);
          }

          break;
        }
        ++tagCount;
      }
    } else if (name == "line") {
      int tagCount = 0;
      int curNumber = -1;
      int curHits = -1;
      while (true) {
        if (this->SkipThisClass) {
          break;
        }
        if (strcmp(atts[tagCount], "hits") == 0) {
          curHits = atoi(atts[tagCount + 1]);
        } else if (strcmp(atts[tagCount], "number") == 0) {
          curNumber = atoi(atts[tagCount + 1]);
        }

        if (curHits > -1 && curNumber > 0) {
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          {
            curFileLines[curNumber - 1] = curHits;
          }
          break;
        }
        ++tagCount;
      }
    }
  }